

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# textures.c
# Opt level: O3

void ImageResize(Image *image,int newWidth,int newHeight)

{
  uint uVar1;
  int input_w;
  int format;
  void *alloc_context;
  int iVar2;
  void *pvVar3;
  uint uVar4;
  stbir_colorspace in_stack_ffffffffffffffb8;
  
  alloc_context = image->data;
  if (((alloc_context != (void *)0x0) && (uVar1 = image->width, uVar1 != 0)) &&
     (input_w = image->height, input_w != 0)) {
    format = image->format;
    iVar2 = GetPixelDataSize(1,1,format);
    pvVar3 = malloc((long)(newHeight * newWidth * iVar2));
    uVar4 = format - 1;
    if ((uVar4 < 7) && ((0x4bU >> (uVar4 & 0x1f) & 1) != 0)) {
      stbir__resize_arbitrary
                (alloc_context,(void *)(ulong)uVar1,input_w,0,(int)pvVar3,
                 (void *)(ulong)(uint)newWidth,newHeight,0,0,0.0,0.0,1.0,1.0,
                 (float *)(ulong)*(uint *)(&DAT_001677e4 + (ulong)uVar4 * 4),-1,0,0,STBIR_TYPE_UINT8
                 ,STBIR_FILTER_DEFAULT,STBIR_FILTER_BOX,STBIR_EDGE_CLAMP,0,in_stack_ffffffffffffffb8
                );
    }
    free(image->data);
    image->data = pvVar3;
    image->width = newWidth;
    image->height = newHeight;
  }
  return;
}

Assistant:

void ImageResize(Image *image, int newWidth, int newHeight)
{
    // Security check to avoid program crash
    if ((image->data == NULL) || (image->width == 0) || (image->height == 0)) return;

    bool fastPath = true;
    if ((image->format != PIXELFORMAT_UNCOMPRESSED_GRAYSCALE) && (image->format != PIXELFORMAT_UNCOMPRESSED_GRAY_ALPHA) && (image->format != PIXELFORMAT_UNCOMPRESSED_R8G8B8) && (image->format != PIXELFORMAT_UNCOMPRESSED_R8G8B8A8)) fastPath = true;

    if (fastPath)
    {
        int bytesPerPixel = GetPixelDataSize(1, 1, image->format);
        unsigned char *output = RL_MALLOC(newWidth*newHeight*bytesPerPixel);

        switch (image->format)
        {
            case PIXELFORMAT_UNCOMPRESSED_GRAYSCALE: stbir_resize_uint8((unsigned char *)image->data, image->width, image->height, 0, output, newWidth, newHeight, 0, 1); break;
            case PIXELFORMAT_UNCOMPRESSED_GRAY_ALPHA: stbir_resize_uint8((unsigned char *)image->data, image->width, image->height, 0, output, newWidth, newHeight, 0, 2); break;
            case PIXELFORMAT_UNCOMPRESSED_R8G8B8: stbir_resize_uint8((unsigned char *)image->data, image->width, image->height, 0, output, newWidth, newHeight, 0, 3); break;
            case PIXELFORMAT_UNCOMPRESSED_R8G8B8A8: stbir_resize_uint8((unsigned char *)image->data, image->width, image->height, 0, output, newWidth, newHeight, 0, 4); break;
            default: break;
        }

        RL_FREE(image->data);
        image->data = output;
        image->width = newWidth;
        image->height = newHeight;
    }
    else
    {
        // Get data as Color pixels array to work with it
        Color *pixels = LoadImageColors(*image);
        Color *output = (Color *)RL_MALLOC(newWidth*newHeight*sizeof(Color));

        // NOTE: Color data is casted to (unsigned char *), there shouldn't been any problem...
        stbir_resize_uint8((unsigned char *)pixels, image->width, image->height, 0, (unsigned char *)output, newWidth, newHeight, 0, 4);

        int format = image->format;

        UnloadImageColors(pixels);
        RL_FREE(image->data);

        image->data = output;
        image->width = newWidth;
        image->height = newHeight;
        image->format = PIXELFORMAT_UNCOMPRESSED_R8G8B8A8;

        ImageFormat(image, format);  // Reformat 32bit RGBA image to original format
    }
}